

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

size_t capnp::anon_unknown_31::findLargestElementBefore<unsigned_int>
                 (Vector<unsigned_int> *vec,uint *key)

{
  uint *puVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Fault f;
  
  puVar1 = (vec->builder).ptr;
  lVar3 = (long)(vec->builder).pos - (long)puVar1;
  if ((lVar3 != 0) && (*puVar1 <= *key)) {
    sVar2 = 0;
    uVar5 = lVar3 >> 2;
    while (uVar4 = uVar5, 1 < uVar4 - sVar2) {
      uVar5 = sVar2 + uVar4 >> 1;
      if (puVar1[uVar5] <= *key) {
        sVar2 = uVar5;
        uVar5 = uVar4;
      }
    }
    return sVar2;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x2a,FAILED,"vec.size() > 0 && vec[0] <= key","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }